

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O2

QVariant * __thiscall
QMYSQLResult::data(QVariant *__return_storage_ptr__,QMYSQLResult *this,int field)

{
  QMetaType *this_00;
  enum_field_types eVar1;
  long lVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  double dVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char cVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  undefined4 uVar15;
  long lVar16;
  uint64_t uVar17;
  qint64 qVar18;
  quint64 qVar19;
  longlong lVar20;
  char **ppcVar21;
  char *pcVar22;
  long lVar23;
  QDate QVar24;
  anon_union_24_3_e3d07ef4_for_data *this_01;
  QMyField *f;
  long in_FS_OFFSET;
  ulong local_c8;
  bool ok;
  QArrayDataPointer<char16_t> local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *pcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x8;
  cVar11 = QSqlResult::isSelect();
  if ((cVar11 == '\0') || (lVar23 = (long)field, *(long *)(lVar2 + 0xd0) <= lVar23)) {
    lcMysql();
    if (((byte)lcMysql::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_58._0_4_ = 2;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      local_58._16_4_ = 0;
      local_58._20_4_ = 0;
      pcStack_40 = lcMysql::category.name;
      QMessageLogger::warning
                ((char *)local_58.data,"QMYSQLResult::data: column %d out of range",
                 (ulong)(uint)field);
    }
LAB_00109b38:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    lVar16 = QSqlResult::driver();
    if (lVar16 == 0) goto LAB_00109b38;
    f = (QMyField *)(lVar23 * 0x28 + *(long *)(lVar2 + 200));
    local_b8.size = 0;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (char16_t *)0x0;
    if (*(char *)(lVar2 + 0xfd) == '\x01') {
      if (f->nullIndicator == true) goto LAB_00109baf;
      if (f->myField->type == MYSQL_TYPE_BIT) {
        pcVar22 = f->outField;
        goto LAB_00109b92;
      }
      this_00 = &f->type;
      uVar12 = QMetaType::registerHelper(this_00);
      if ((0x25 < uVar12) || ((0x360000003cU >> ((ulong)uVar12 & 0x3f) & 1) == 0)) {
        eVar1 = f->myField->type;
        if ((MYSQL_TYPE_DATETIME < eVar1) ||
           (((0x1480U >> (eVar1 & (MYSQL_TYPE_BIT|MYSQL_TYPE_VARCHAR)) & 1) == 0 ||
            (f->bufLength < 0x28)))) {
          iVar13 = QMetaType::registerHelper(this_00);
          if (iVar13 != 0xc) {
            QString::fromUtf8((QString *)&local_58,f->outField,f->bufLength);
            pDVar6 = (Data *)CONCAT44(local_58._4_4_,local_58._0_4_);
            pcVar7 = (char16_t *)CONCAT44(local_58._12_4_,local_58._8_4_);
            local_58._0_4_ = SUB84(local_b8.d,0);
            local_58._4_4_ = (undefined4)((ulong)local_b8.d >> 0x20);
            local_58._8_4_ = SUB84(local_b8.ptr,0);
            local_58._12_4_ = (undefined4)((ulong)local_b8.ptr >> 0x20);
            lVar16 = CONCAT44(local_58._20_4_,local_58._16_4_);
            local_58._16_4_ = (undefined4)local_b8.size;
            local_58._20_4_ = (undefined4)((ulong)local_b8.size >> 0x20);
            local_b8.d = pDVar6;
            local_b8.ptr = pcVar7;
            local_b8.size = lVar16;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_58);
          }
          local_c8 = 0;
          goto LAB_00109c60;
        }
        piVar3 = (int *)f->outField;
        iVar13 = QMetaType::registerHelper(this_00);
        if (iVar13 == 0xf) {
          QVar24.jd = -0x8000000000000000;
        }
        else {
          QDate::QDate((QDate *)&local_58.shared,*piVar3,piVar3[1],piVar3[2]);
          QVar24.jd = CONCAT44(local_58._4_4_,local_58._0_4_);
        }
        iVar13 = QMetaType::registerHelper(this_00);
        if (iVar13 == 0xe) {
          uVar15 = -1;
        }
        else {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(piVar3 + 6);
          QTime::QTime((QTime *)&local_58,piVar3[3],piVar3[4],piVar3[5],
                       SUB164(auVar4 / ZEXT816(1000),0));
          uVar15 = local_58._0_4_;
        }
        iVar13 = QMetaType::registerHelper(this_00);
        if (iVar13 != 0x10) {
          iVar13 = QMetaType::registerHelper(this_00);
          if (iVar13 != 0xe) goto LAB_0010a03e;
          goto LAB_0010a02e;
        }
        local_78._forAlignment = 9.88131291682493e-324;
        QDateTime::QDateTime((QDateTime *)&local_58,QVar24.jd,uVar15,&local_78,1);
        QVariant::QVariant(__return_storage_ptr__,(QDateTime *)local_58.data);
        QDateTime::~QDateTime((QDateTime *)local_58.data);
        QTimeZone::~QTimeZone((QTimeZone *)&local_78.shared);
        goto LAB_0010a1c4;
      }
      local_58._16_4_ = 0xaaaaaaaa;
      local_58._20_4_ = 0xaaaaaaaa;
      pcStack_40 = (char *)0xaaaaaaaaaaaaaaaa;
      local_58._0_4_ = -0x55555556;
      local_58._4_4_ = 0xaaaaaaaa;
      local_58._8_4_ = 0xaaaaaaaa;
      local_58._12_4_ = 0xaaaaaaaa;
      QVariant::QVariant((QVariant *)&local_58,(f->type).d_ptr,f->outField);
      iVar13 = QMetaType::registerHelper(this_00);
      if (iVar13 == 0x25) {
        uVar12 = QVariant::toUInt((bool *)local_58.data);
        QVariant::QVariant(__return_storage_ptr__,uVar12);
      }
      else {
        iVar13 = QMetaType::registerHelper(this_00);
        if (iVar13 == 0x22) {
          iVar13 = QVariant::toInt((bool *)local_58.data);
          QVariant::QVariant(__return_storage_ptr__,iVar13);
        }
        else {
          *(ulong *)((long)&(__return_storage_ptr__->d).data + 0x10) =
               CONCAT44(local_58._20_4_,local_58._16_4_);
          *(char **)&(__return_storage_ptr__->d).field_0x18 = pcStack_40;
          (__return_storage_ptr__->d).data.shared =
               (PrivateShared *)CONCAT44(local_58._4_4_,local_58._0_4_);
          *(ulong *)((long)&(__return_storage_ptr__->d).data + 8) =
               CONCAT44(local_58._12_4_,local_58._8_4_);
          local_58._0_4_ = 0;
          local_58._4_4_ = 0;
          local_58._8_4_ = 0;
          local_58._12_4_ = 0;
          local_58._16_4_ = 0;
          local_58._20_4_ = 0;
          pcStack_40 = (char *)0x2;
        }
      }
LAB_0010a1ba:
      QVariant::~QVariant((QVariant *)&local_58);
    }
    else {
      pcVar22 = *(char **)(*(long *)(lVar2 + 0xb8) + lVar23 * 8);
      if (pcVar22 == (char *)0x0) {
LAB_00109baf:
        QVariant::QVariant(__return_storage_ptr__,(f->type).d_ptr,(void *)0x0);
      }
      else if (f->myField->type == MYSQL_TYPE_BIT) {
LAB_00109b92:
        uVar17 = qDecodeBitfield(f,pcVar22);
        local_58._0_4_ = (undefined4)uVar17;
        local_58._4_4_ = (undefined4)(uVar17 >> 0x20);
        QVariant::fromValue<unsigned_long,_true>
                  (__return_storage_ptr__,(unsigned_long *)local_58.data);
      }
      else {
        lVar16 = mysql_fetch_lengths(*(undefined8 *)(lVar2 + 0xb0));
        local_c8 = *(ulong *)(lVar16 + lVar23 * 8);
        iVar13 = QMetaType::registerHelper(&f->type);
        if (iVar13 != 0xc) {
          QString::fromUtf8((QString *)&local_58,*(char **)(*(long *)(lVar2 + 0xb8) + lVar23 * 8),
                            local_c8);
          pDVar6 = (Data *)CONCAT44(local_58._4_4_,local_58._0_4_);
          pcVar7 = (char16_t *)CONCAT44(local_58._12_4_,local_58._8_4_);
          local_58._0_4_ = SUB84(local_b8.d,0);
          local_58._4_4_ = (undefined4)((ulong)local_b8.d >> 0x20);
          local_58._8_4_ = SUB84(local_b8.ptr,0);
          local_58._12_4_ = (undefined4)((ulong)local_b8.ptr >> 0x20);
          lVar16 = CONCAT44(local_58._20_4_,local_58._16_4_);
          local_58._16_4_ = (undefined4)local_b8.size;
          local_58._20_4_ = (undefined4)((ulong)local_b8.size >> 0x20);
          local_b8.d = pDVar6;
          local_b8.ptr = pcVar7;
          local_b8.size = lVar16;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        }
LAB_00109c60:
        iVar13 = QMetaType::registerHelper(&f->type);
        switch(iVar13) {
        case 3:
switchD_00109c83_caseD_3:
          uVar14 = QString::toUInt((QString *)&local_b8,(bool *)0x0,10);
          QVariant::QVariant(__return_storage_ptr__,uVar14);
          break;
        case 4:
          qVar18 = QString::toLongLong((QString *)&local_b8,(bool *)0x0,10);
          QVariant::QVariant(__return_storage_ptr__,qVar18);
          break;
        case 5:
          qVar19 = QString::toULongLong((QString *)&local_b8,(bool *)0x0,10);
          QVariant::QVariant(__return_storage_ptr__,qVar19);
          break;
        case 6:
          local_58._16_4_ = 0;
          local_58._20_4_ = 0;
          local_58._0_4_ = 0;
          local_58._4_4_ = 0;
          local_58._8_4_ = 0;
          local_58._12_4_ = 0;
          pcStack_40 = (char *)0x2;
          bVar8 = false;
          dVar5 = (double)QString::toDouble((bool *)&local_b8);
          iVar13 = QSqlResult::numericalPrecisionPolicy();
          if (iVar13 == 4) {
            this_01 = &local_78;
            QVariant::QVariant((QVariant *)this_01,dVar5);
            QVariant::operator=((QVariant *)&local_58,(QVariant *)this_01);
LAB_0010a142:
            QVariant::~QVariant((QVariant *)this_01);
          }
          else {
            if (iVar13 == 2) {
              QVariant::QVariant((QVariant *)&local_98,dVar5);
              lVar20 = QVariant::toLongLong((bool *)local_98.data);
              QVariant::QVariant((QVariant *)&local_78,lVar20);
LAB_0010a10c:
              this_01 = &local_98;
              QVariant::operator=((QVariant *)&local_58,(QVariant *)&local_78);
              QVariant::~QVariant((QVariant *)&local_78);
              goto LAB_0010a142;
            }
            if (iVar13 == 1) {
              QVariant::QVariant((QVariant *)&local_98,dVar5);
              iVar13 = QVariant::toInt((bool *)local_98.data);
              QVariant::QVariant((QVariant *)&local_78,iVar13);
              goto LAB_0010a10c;
            }
            QVariant::QVariant((QVariant *)&local_78,(QString *)&local_b8);
            QVariant::operator=((QVariant *)&local_58,(QVariant *)&local_78);
            QVariant::~QVariant((QVariant *)&local_78);
            bVar8 = true;
          }
          if (bVar8) {
            ppcVar21 = &pcStack_40;
            *(ulong *)((long)&(__return_storage_ptr__->d).data + 0x10) =
                 CONCAT44(local_58._20_4_,local_58._16_4_);
            *(char **)&(__return_storage_ptr__->d).field_0x18 = pcStack_40;
            (__return_storage_ptr__->d).data.shared =
                 (PrivateShared *)CONCAT44(local_58._4_4_,local_58._0_4_);
            *(ulong *)((long)&(__return_storage_ptr__->d).data + 8) =
                 CONCAT44(local_58._12_4_,local_58._8_4_);
            local_58._0_4_ = 0;
            local_58._4_4_ = 0;
            local_58._8_4_ = 0;
            local_58._12_4_ = 0;
            local_58._16_4_ = 0;
            local_58._20_4_ = 0;
          }
          else {
            (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
            *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
            *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
            ppcVar21 = (char **)&(__return_storage_ptr__->d).field_0x18;
          }
          *ppcVar21 = (char *)0x2;
          goto LAB_0010a1ba;
        case 7:
        case 8:
        case 9:
        case 10:
        case 0xb:
        case 0xd:
switchD_00109c83_caseD_7:
          QVariant::QVariant(__return_storage_ptr__,(QString *)&local_b8);
          break;
        case 0xc:
          local_58._16_4_ = 0;
          local_58._20_4_ = 0;
          local_58._0_4_ = 0;
          local_58._4_4_ = 0;
          local_58._8_4_ = 0;
          local_58._12_4_ = 0;
          if (*(char *)(lVar2 + 0xfd) == '\x01') {
            pcVar22 = f->outField;
            local_c8 = f->bufLength;
          }
          else {
            pcVar22 = *(char **)(*(long *)(lVar2 + 0xb8) + lVar23 * 8);
          }
          QByteArray::QByteArray((QByteArray *)&local_78,pcVar22,local_c8);
          uVar10 = local_78._8_8_;
          uVar9 = local_78.shared;
          local_78.shared = (PrivateShared *)0x0;
          local_78._8_8_ = 0;
          local_58._0_4_ = (undefined4)uVar9;
          local_58._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
          local_58._8_4_ = (undefined4)uVar10;
          local_58._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
          local_58._16_4_ = (undefined4)local_78._16_8_;
          local_58._20_4_ = (undefined4)((ulong)local_78._16_8_ >> 0x20);
          local_78._16_8_ = 0;
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
          QVariant::QVariant(__return_storage_ptr__,(QByteArray *)&local_58);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
          break;
        case 0xe:
          if (local_b8.size == 0) {
            QVar24.jd = -0x8000000000000000;
          }
          else {
            QVar24 = QDate::fromString((QString *)&local_b8,ISODate);
          }
LAB_0010a02e:
          QVariant::QVariant(__return_storage_ptr__,QVar24);
          break;
        case 0xf:
          if (local_b8.size == 0) {
            uVar15 = -1;
          }
          else {
            uVar15 = QTime::fromString((QString *)&local_b8,ISODate);
          }
LAB_0010a03e:
          QVariant::QVariant(__return_storage_ptr__,(QTime)uVar15);
          break;
        case 0x10:
          if (local_b8.size == 0xe) {
            lVar20 = QString::insert((longlong)&local_b8,(QChar)0x4);
            lVar20 = QString::insert(lVar20,(QChar)0x7);
            lVar20 = QString::insert(lVar20,(QChar)0xa);
            lVar20 = QString::insert(lVar20,(QChar)0xd);
            QString::insert(lVar20,(QChar)0x10);
LAB_0010a092:
            cVar11 = QString::endsWith((QChar)(char16_t)&local_b8,0x5a);
            if (cVar11 == '\0') {
              QString::append((QChar)(char16_t)&local_b8);
            }
            QDateTime::fromString((QDateTime *)local_58.data,(QString *)&local_b8,ISODate);
          }
          else {
            if (local_b8.size != 0) goto LAB_0010a092;
            QDateTime::QDateTime((QDateTime *)local_58.data);
          }
          QVariant::QVariant(__return_storage_ptr__,(QDateTime *)local_58.data);
          QDateTime::~QDateTime((QDateTime *)local_58.data);
          break;
        default:
          if (1 < iVar13 - 0x21U) {
            if (1 < iVar13 - 0x24U) goto switchD_00109c83_caseD_7;
            goto switchD_00109c83_caseD_3;
          }
        case 2:
          iVar13 = QString::toInt((QString *)&local_b8,(bool *)0x0,10);
          QVariant::QVariant(__return_storage_ptr__,iVar13);
        }
      }
    }
LAB_0010a1c4:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QMYSQLResult::data(int field)
{
    Q_D(QMYSQLResult);
    if (!isSelect() || field >= d->fields.size()) {
        qCWarning(lcMysql, "QMYSQLResult::data: column %d out of range", field);
        return QVariant();
    }

    if (!driver())
        return QVariant();

    my_ulonglong fieldLength = 0;
    const QMYSQLResultPrivate::QMyField &f = d->fields.at(field);
    QString val;
    if (d->preparedQuery) {
        if (f.nullIndicator)
            return QVariant(f.type);
        if (qIsBitfield(f.myField->type)) {
            return QVariant::fromValue(qDecodeBitfield(f, f.outField));
        } else if (qIsInteger(f.type.id())) {
            QVariant variant(f.type, f.outField);
            // we never want to return char variants here, see QTBUG-53397
            if (f.type.id() == QMetaType::UChar)
                return variant.toUInt();
            else if (f.type.id() == QMetaType::Char)
                return variant.toInt();
            return variant;
        } else if (qIsTimeOrDate(f.myField->type) && f.bufLength >= sizeof(QT_MYSQL_TIME)) {
            auto t = reinterpret_cast<const QT_MYSQL_TIME *>(f.outField);
            QDate date;
            QTime time;
            if (f.type.id() != QMetaType::QTime)
                date = QDate(t->year, t->month, t->day);
            if (f.type.id() != QMetaType::QDate)
                time = QTime(t->hour, t->minute, t->second, t->second_part / 1000);
            if (f.type.id() == QMetaType::QDateTime)
                return QDateTime(date, time, QTimeZone::UTC);
            else if (f.type.id() == QMetaType::QDate)
                return date;
            else
                return time;
        }

        if (f.type.id() != QMetaType::QByteArray)
            val = QString::fromUtf8(f.outField, f.bufLength);
    } else {
        if (d->row[field] == nullptr) {
            // NULL value
            return QVariant(f.type);
        }

        if (qIsBitfield(f.myField->type))
            return QVariant::fromValue(qDecodeBitfield(f, d->row[field]));

        fieldLength = mysql_fetch_lengths(d->result)[field];

        if (f.type.id() != QMetaType::QByteArray)
            val = QString::fromUtf8(d->row[field], fieldLength);
    }

    switch (f.type.id()) {
    case QMetaType::LongLong:
        return QVariant(val.toLongLong());
    case QMetaType::ULongLong:
        return QVariant(val.toULongLong());
    case QMetaType::Char:
    case QMetaType::Short:
    case QMetaType::Int:
        return QVariant(val.toInt());
    case QMetaType::UChar:
    case QMetaType::UShort:
    case QMetaType::UInt:
        return QVariant(val.toUInt());
    case QMetaType::Double: {
        QVariant v;
        bool ok=false;
        double dbl = val.toDouble(&ok);
        switch(numericalPrecisionPolicy()) {
            case QSql::LowPrecisionInt32:
                v=QVariant(dbl).toInt();
                break;
            case QSql::LowPrecisionInt64:
                v = QVariant(dbl).toLongLong();
                break;
            case QSql::LowPrecisionDouble:
                v = QVariant(dbl);
                break;
            case QSql::HighPrecision:
            default:
                v = val;
                ok = true;
                break;
        }
        if (ok)
            return v;
        return QVariant();
    }
    case QMetaType::QDate:
        return qDateFromString(val);
    case QMetaType::QTime:
        return qTimeFromString(val);
    case QMetaType::QDateTime:
        return qDateTimeFromString(val);
    case QMetaType::QByteArray: {

        QByteArray ba;
        if (d->preparedQuery) {
            ba = QByteArray(f.outField, f.bufLength);
        } else {
            ba = QByteArray(d->row[field], fieldLength);
        }
        return QVariant(ba);
    }
    case QMetaType::QString:
    default:
        return QVariant(val);
    }
    Q_UNREACHABLE();
}